

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFortranParserImpl.cxx
# Opt level: O0

void __thiscall
cmFortranParser_s::cmFortranParser_s
          (cmFortranParser_s *this,cmFortranCompiler *fc,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *includes,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *defines,cmFortranSourceInfo *info)

{
  YY_BUFFER_STATE new_buffer;
  YY_BUFFER_STATE buffer;
  cmFortranSourceInfo *info_local;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *defines_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *includes_local;
  cmFortranCompiler *fc_local;
  cmFortranParser_s *this_local;
  
  cmFortranCompiler::cmFortranCompiler(&this->Compiler,fc);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->IncludePath,includes);
  std::stack<cmFortranFile,std::deque<cmFortranFile,std::allocator<cmFortranFile>>>::
  stack<std::deque<cmFortranFile,std::allocator<cmFortranFile>>,void>
            ((stack<cmFortranFile,std::deque<cmFortranFile,std::allocator<cmFortranFile>>> *)
             &this->FileStack);
  std::__cxx11::string::string((string *)&this->TokenString);
  std::__cxx11::string::string((string *)&this->Error);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(&this->PPDefinitions,defines);
  std::stack<bool,std::deque<bool,std::allocator<bool>>>::
  stack<std::deque<bool,std::allocator<bool>>,void>
            ((stack<bool,std::deque<bool,std::allocator<bool>>> *)&this->SkipToEnd);
  this->Info = info;
  this->InInterface = false;
  this->InPPFalseBranch = 0;
  cmFortran_yylex_init(&this->Scanner);
  cmFortran_yyset_extra(this,this->Scanner);
  new_buffer = cmFortran_yy_create_buffer((FILE *)0x0,4,this->Scanner);
  cmFortran_yy_switch_to_buffer(new_buffer,this->Scanner);
  return;
}

Assistant:

cmFortranParser_s::cmFortranParser_s(cmFortranCompiler fc,
                                     std::vector<std::string> includes,
                                     std::set<std::string> defines,
                                     cmFortranSourceInfo& info)
  : Compiler(std::move(fc))
  , IncludePath(std::move(includes))
  , PPDefinitions(std::move(defines))
  , Info(info)
{
  this->InInterface = false;
  this->InPPFalseBranch = 0;

  // Initialize the lexical scanner.
  cmFortran_yylex_init(&this->Scanner);
  cmFortran_yyset_extra(this, this->Scanner);

  // Create a dummy buffer that is never read but is the fallback
  // buffer when the last file is popped off the stack.
  YY_BUFFER_STATE buffer =
    cmFortran_yy_create_buffer(nullptr, 4, this->Scanner);
  cmFortran_yy_switch_to_buffer(buffer, this->Scanner);
}